

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

void append(vec *v,void *element)

{
  uint uVar1;
  uint64 uVar2;
  void *__src;
  uint64 uVar3;
  void *__dest;
  
  uVar2 = v->size;
  if (uVar2 == v->cap) {
    uVar3 = v->cap * 2;
    v->cap = uVar3;
    uVar1 = v->element_size;
    __dest = malloc(uVar3 * uVar1);
    __src = v->start;
    memcpy(__dest,__src,uVar2 * uVar1);
    free(__src);
    v->start = __dest;
  }
  memcpy((void *)(v->size * (ulong)v->element_size + (long)v->start),element,(ulong)v->element_size)
  ;
  v->size = v->size + 1;
  return;
}

Assistant:

void append(vec *v, void *element) {
    if (v->size == v->cap) {
        v->cap *= 2;
        void *new = malloc(v->cap * v->element_size);
        memcpy(new, v->start, v->size * v->element_size);
        free(v->start);
        v->start = new;
    }
    memcpy(v->start + v->size * v->element_size, element, v->element_size);
    v->size++;
}